

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

void __thiscall QTabBarPrivate::layoutTabs(QTabBarPrivate *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QWidget *this_00;
  Tab *pTVar5;
  ulong uVar6;
  QWidget *widget;
  int iVar7;
  int iVar8;
  int iVar9;
  LayoutDirection LVar10;
  QStyle *pQVar11;
  pointer pQVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  pointer pQVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ArrowType type;
  int iVar19;
  ArrowType type_00;
  Representation space;
  int i;
  Representation RVar20;
  ulong uVar21;
  int iVar22;
  long in_FS_OFFSET;
  QRect QVar23;
  QRect QVar24;
  QRect QVar25;
  ulong local_f8;
  Representation local_f0;
  Representation local_e0;
  QSize local_c0;
  QRect local_b8;
  QRect local_a8;
  QArrayDataPointer<QLayoutStruct> local_98;
  QStyleOption opt;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this->field_0x2d0 = this->field_0x2d0 & 0xfe;
  local_c0 = QWidget::size(this_00);
  uVar18 = this->shape - RoundedWest;
  pQVar11 = QWidget::style(this_00);
  iVar8 = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,5,0,this_00,0);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_98,(this->tabList).d.size + 2);
  pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
  pQVar12->stretch = 0;
  pQVar12->sizeHint = 0;
  pQVar12->maximumSize = 0x7ffff;
  pQVar12->minimumSize = 0;
  pQVar12->expansive = false;
  pQVar12->empty = true;
  pQVar12->spacing = 0;
  uVar1 = *(ushort *)&this->field_0x2d0;
  pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
  pQVar12->expansive = (iVar8 != 8 && iVar8 != 1) && (uVar1 & 0x20) == 0;
  pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
  pQVar12->empty = true;
  if ((uVar18 & 0xfffffffa) == 0) {
    local_c0 = (QSize)((ulong)local_c0 >> 0x20);
    local_f0.m_i = 1;
    local_f8 = 0;
    iVar22 = 0;
    iVar9 = 0;
    for (uVar21 = 0; uVar21 < (ulong)(this->tabList).d.size; uVar21 = uVar21 + 1) {
      pTVar5 = (this->tabList).d.ptr[uVar21];
      if ((pTVar5->field_0xe4 & 2) != 0) {
        uVar16 = (**(code **)(*(long *)this_00 + 0x1a0))(this_00,uVar21 & 0xffffffff);
        (pTVar5->maxRect).x1.m_i = 0;
        iVar19 = (int)(uVar16 >> 0x20);
        (pTVar5->maxRect).y1.m_i = iVar9;
        (pTVar5->maxRect).x2.m_i = (int)uVar16 + -1;
        (pTVar5->maxRect).y2.m_i = iVar19 + iVar9 + -1;
        uVar6 = local_f8;
        if ((int)local_f8 <= (int)uVar16) {
          uVar6 = uVar16;
        }
        local_f8 = uVar6 & 0xffffffff;
        uVar13 = (**(code **)(*(long *)this_00 + 0x1a8))(this_00);
        iVar7 = (int)((ulong)uVar13 >> 0x20);
        (pTVar5->minRect).x1.m_i = 0;
        (pTVar5->minRect).y1.m_i = iVar22;
        (pTVar5->minRect).x2.m_i = (int)uVar13 + -1;
        (pTVar5->minRect).y2.m_i = iVar22 + iVar7 + -1;
        lVar17 = (long)local_f0.m_i;
        pQVar15 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12 = pQVar15 + lVar17;
        pQVar12->stretch = 0;
        pQVar12->sizeHint = 0;
        pQVar12->maximumSize = 0x7ffff;
        pQVar12->minimumSize = 0;
        pQVar15[lVar17].expansive = false;
        pQVar15[lVar17].empty = true;
        pQVar15[lVar17].spacing = 0;
        iVar2 = (pTVar5->maxRect).y2.m_i;
        iVar3 = (pTVar5->maxRect).y1.m_i;
        pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12[lVar17].sizeHint = (iVar2 - iVar3) + 1;
        pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12[lVar17].minimumSize = iVar7;
        pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12[lVar17].empty = false;
        pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12[lVar17].expansive = true;
        if ((this->field_0x2d0 & 0x20) == 0) {
          pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
          iVar2 = pQVar12[lVar17].sizeHint;
          pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
          pQVar12[lVar17].maximumSize = iVar2;
        }
        iVar9 = iVar9 + iVar19;
        iVar22 = iVar22 + iVar7;
        local_f0.m_i = local_f0.m_i + 1;
      }
    }
  }
  else {
    local_f0.m_i = 1;
    iVar9 = 0;
    iVar22 = 0;
    local_f8._0_4_ = 0;
    for (uVar21 = 0; uVar21 < (ulong)(this->tabList).d.size; uVar21 = uVar21 + 1) {
      pTVar5 = (this->tabList).d.ptr[uVar21];
      if ((pTVar5->field_0xe4 & 2) != 0) {
        uVar13 = (**(code **)(*(long *)this_00 + 0x1a0))(this_00,uVar21 & 0xffffffff);
        iVar19 = (int)((ulong)uVar13 >> 0x20);
        (pTVar5->maxRect).x1.m_i = iVar9;
        (pTVar5->maxRect).y1.m_i = 0;
        (pTVar5->maxRect).x2.m_i = (int)uVar13 + iVar9 + -1;
        (pTVar5->maxRect).y2.m_i = iVar19 + -1;
        if (iVar19 < (int)local_f8) {
          iVar19 = (int)local_f8;
        }
        local_f8._0_4_ = iVar19;
        uVar14 = (**(code **)(*(long *)this_00 + 0x1a8))(this_00);
        iVar3 = (int)uVar14;
        (pTVar5->minRect).x1.m_i = iVar22;
        (pTVar5->minRect).y1.m_i = 0;
        (pTVar5->minRect).x2.m_i = iVar22 + iVar3 + -1;
        (pTVar5->minRect).y2.m_i = (int)((ulong)uVar14 >> 0x20) + -1;
        lVar17 = (long)local_f0.m_i;
        pQVar15 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12 = pQVar15 + lVar17;
        pQVar12->stretch = 0;
        pQVar12->sizeHint = 0;
        pQVar12->maximumSize = 0x7ffff;
        pQVar12->minimumSize = 0;
        pQVar15[lVar17].expansive = false;
        pQVar15[lVar17].empty = true;
        pQVar15[lVar17].spacing = 0;
        iVar19 = (pTVar5->maxRect).x2.m_i;
        iVar2 = (pTVar5->maxRect).x1.m_i;
        pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12[lVar17].sizeHint = (iVar19 - iVar2) + 1;
        pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12[lVar17].minimumSize = iVar3;
        pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12[lVar17].empty = false;
        pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
        pQVar12[lVar17].expansive = true;
        if ((this->field_0x2d0 & 0x20) == 0) {
          pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
          iVar19 = pQVar12[lVar17].sizeHint;
          pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
          pQVar12[lVar17].maximumSize = iVar19;
        }
        iVar9 = iVar9 + (int)uVar13;
        iVar22 = iVar22 + iVar3;
        local_f0.m_i = local_f0.m_i + 1;
      }
    }
  }
  lVar17 = (long)local_f0.m_i;
  pQVar15 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
  pQVar12 = pQVar15 + lVar17;
  pQVar12->stretch = 0;
  pQVar12->sizeHint = 0;
  pQVar12->maximumSize = 0x7ffff;
  pQVar12->minimumSize = 0;
  pQVar15[lVar17].expansive = false;
  pQVar15[lVar17].empty = true;
  pQVar15[lVar17].spacing = 0;
  uVar1 = *(ushort *)&this->field_0x2d0;
  pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
  pQVar12[lVar17].expansive = (iVar8 != 2 && iVar8 != 8) && (uVar1 & 0x20) == 0;
  pQVar12 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_98);
  pQVar12[lVar17].empty = true;
  RVar20 = local_c0.wd.m_i;
  space.m_i = RVar20.m_i;
  if (RVar20.m_i < iVar22) {
    space.m_i = iVar22;
  }
  uVar21 = 0;
  qGeomCalc((QList<QLayoutStruct> *)&local_98,0,(int)local_98.size,0,space.m_i,0);
  iVar8 = 1;
  while (uVar6 = (this->tabList).d.size, uVar21 < uVar6) {
    pTVar5 = (this->tabList).d.ptr[uVar21];
    if ((pTVar5->field_0xe4 & 2) == 0) {
      (pTVar5->rect).x1 = 0;
      (pTVar5->rect).y1 = 0;
      (pTVar5->rect).x2 = -1;
      (pTVar5->rect).y2 = -1;
      uVar21 = uVar21 + 1;
      iVar8 = iVar8 + -1;
    }
    else {
      iVar19 = iVar8 + (int)uVar21;
      iVar9 = local_98.ptr[iVar19].pos;
      iVar19 = local_98.ptr[iVar19].size;
      if ((uVar18 & 0xfffffffa) == 0) {
        (pTVar5->rect).x1.m_i = 0;
        (pTVar5->rect).y1.m_i = iVar9;
        (pTVar5->rect).x2.m_i = (int)local_f8 + -1;
        iVar9 = iVar9 + iVar19 + -1;
      }
      else {
        (pTVar5->rect).x1.m_i = iVar9;
        (pTVar5->rect).y1.m_i = 0;
        (pTVar5->rect).x2.m_i = iVar9 + iVar19 + -1;
        iVar9 = (int)local_f8 + -1;
      }
      (pTVar5->rect).y2.m_i = iVar9;
      uVar21 = uVar21 + 1;
    }
  }
  if (((RVar20.m_i < iVar22) && (uVar6 != 0)) && ((*(ushort *)&this->field_0x2d0 & 8) != 0)) {
    QVar23 = normalizedScrollRect(this,0);
    widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption(&opt,1,0);
    QStyleOption::initFrom(&opt,widget);
    pQVar11 = QWidget::style(widget);
    QVar24 = (QRect)(**(code **)(*(long *)pQVar11 + 0xc0))(pQVar11,0x35,&opt,widget);
    local_a8 = QVar24;
    pQVar11 = QWidget::style(widget);
    QVar25 = (QRect)(**(code **)(*(long *)pQVar11 + 0xc0))(pQVar11,0x36,&opt,widget);
    local_b8 = QVar25;
    pQVar11 = QWidget::style(widget);
    iVar8 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x33,&opt,widget);
    if ((uVar18 & 0xfffffffa) == 0) {
      local_a8.y2.m_i = iVar8 + QVar24.y1.m_i.m_i + -1;
      local_b8.y1.m_i = (QVar25.y2.m_i.m_i - iVar8) + 1;
      type = DownArrow;
      type_00 = UpArrow;
    }
    else {
      LVar10 = QWidget::layoutDirection(widget);
      if (LVar10 == RightToLeft) {
        local_e0 = QVar25.x1.m_i;
        local_b8.x2.m_i = iVar8 + -1 + local_e0.m_i;
        local_a8.x1.m_i = (QVar24.x2.m_i.m_i - iVar8) + 1;
        type = LeftArrow;
        type_00 = RightArrow;
      }
      else {
        local_a8.x2.m_i = iVar8 + -1 + QVar24.x1.m_i.m_i;
        local_b8.x1.m_i = (QVar25.x2.m_i.m_i - iVar8) + 1;
        type = RightArrow;
        type_00 = LeftArrow;
      }
    }
    QToolButton::setArrowType(this->leftB,type_00);
    QToolButton::setArrowType(this->rightB,type);
    QWidget::setGeometry((QWidget *)this->leftB,&local_a8);
    QWidget::setEnabled((QWidget *)this->leftB,false);
    QWidget::show((QWidget *)this->leftB);
    QWidget::setGeometry((QWidget *)this->rightB,&local_b8);
    local_f0 = QVar23.x1.m_i;
    QWidget::setEnabled((QWidget *)this->rightB,QVar23.x2.m_i.m_i + 1 < iVar22 + local_f0.m_i);
    QWidget::show((QWidget *)this->rightB);
    QStyleOption::~QStyleOption(&opt);
  }
  else {
    QWidget::hide((QWidget *)this->rightB);
    QWidget::hide((QWidget *)this->leftB);
  }
  layoutWidgets(this,0);
  (**(code **)(*(long *)this_00 + 0x1c0))();
  QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBarPrivate::layoutTabs()
{
    Q_Q(QTabBar);
    layoutDirty = false;
    QSize size = q->size();
    int last, available;
    int maxExtent;
    bool vertTabs = verticalTabs(shape);
    int tabChainIndex = 0;
    int hiddenTabs = 0;

    Qt::Alignment tabAlignment = Qt::Alignment(q->style()->styleHint(QStyle::SH_TabBar_Alignment, nullptr, q));
    QList<QLayoutStruct> tabChain(tabList.size() + 2);

    // We put an empty item at the front and back and set its expansive attribute
    // depending on tabAlignment and expanding.
    tabChain[tabChainIndex].init();
    tabChain[tabChainIndex].expansive = (!expanding)
                                        && (tabAlignment != Qt::AlignLeft)
                                        && (tabAlignment != Qt::AlignJustify);
    tabChain[tabChainIndex].empty = true;
    ++tabChainIndex;

    // We now go through our list of tabs and set the minimum size and the size hint
    // This will allow us to elide text if necessary. Since we don't set
    // a maximum size, tabs will EXPAND to fill up the empty space.
    // Since tab widget is rather *ahem* strict about keeping the geometry of the
    // tab bar to its absolute minimum, this won't bleed through, but will show up
    // if you use tab bar on its own (a.k.a. not a bug, but a feature).
    // Update: if expanding is false, we DO set a maximum size to prevent the tabs
    // being wider than necessary.
    if (!vertTabs) {
        int minx = 0;
        int x = 0;
        int maxHeight = 0;
        for (int i = 0; i < tabList.size(); ++i) {
            const auto tab = tabList.at(i);
            if (!tab->visible) {
                ++hiddenTabs;
                continue;
            }
            QSize sz = q->tabSizeHint(i);
            tab->maxRect = QRect(x, 0, sz.width(), sz.height());
            x += sz.width();
            maxHeight = qMax(maxHeight, sz.height());
            sz = q->minimumTabSizeHint(i);
            tab->minRect = QRect(minx, 0, sz.width(), sz.height());
            minx += sz.width();
            tabChain[tabChainIndex].init();
            tabChain[tabChainIndex].sizeHint = tab->maxRect.width();
            tabChain[tabChainIndex].minimumSize = sz.width();
            tabChain[tabChainIndex].empty = false;
            tabChain[tabChainIndex].expansive = true;

            if (!expanding)
                tabChain[tabChainIndex].maximumSize = tabChain[tabChainIndex].sizeHint;
            ++tabChainIndex;
        }

        last = minx;
        available = size.width();
        maxExtent = maxHeight;
    } else {
        int miny = 0;
        int y = 0;
        int maxWidth = 0;
        for (int i = 0; i < tabList.size(); ++i) {
            auto tab = tabList.at(i);
            if (!tab->visible) {
                ++hiddenTabs;
                continue;
            }
            QSize sz = q->tabSizeHint(i);
            tab->maxRect = QRect(0, y, sz.width(), sz.height());
            y += sz.height();
            maxWidth = qMax(maxWidth, sz.width());
            sz = q->minimumTabSizeHint(i);
            tab->minRect = QRect(0, miny, sz.width(), sz.height());
            miny += sz.height();
            tabChain[tabChainIndex].init();
            tabChain[tabChainIndex].sizeHint = tab->maxRect.height();
            tabChain[tabChainIndex].minimumSize = sz.height();
            tabChain[tabChainIndex].empty = false;
            tabChain[tabChainIndex].expansive = true;

            if (!expanding)
                tabChain[tabChainIndex].maximumSize = tabChain[tabChainIndex].sizeHint;
            ++tabChainIndex;
        }

        last = miny;
        available = size.height();
        maxExtent = maxWidth;
    }

    // Mirror our front item.
    tabChain[tabChainIndex].init();
    tabChain[tabChainIndex].expansive = (!expanding)
                                        && (tabAlignment != Qt::AlignRight)
                                        && (tabAlignment != Qt::AlignJustify);
    tabChain[tabChainIndex].empty = true;
    Q_ASSERT(tabChainIndex == tabChain.size() - 1 - hiddenTabs); // add an assert just to make sure.

    // Do the calculation
    qGeomCalc(tabChain, 0, tabChain.size(), 0, qMax(available, last), 0);

    // Use the results
    hiddenTabs = 0;
    for (int i = 0; i < tabList.size(); ++i) {
        auto tab = tabList.at(i);
        if (!tab->visible) {
            tab->rect = QRect();
            ++hiddenTabs;
            continue;
        }
        const QLayoutStruct &lstruct = tabChain.at(i + 1 - hiddenTabs);
        if (!vertTabs)
            tab->rect.setRect(lstruct.pos, 0, lstruct.size, maxExtent);
        else
            tab->rect.setRect(0, lstruct.pos, maxExtent, lstruct.size);
    }

    if (useScrollButtons && tabList.size() && last > available) {
        const QRect scrollRect = normalizedScrollRect(0);

        Q_Q(QTabBar);
        QStyleOption opt;
        opt.initFrom(q);
        QRect scrollButtonLeftRect = q->style()->subElementRect(QStyle::SE_TabBarScrollLeftButton, &opt, q);
        QRect scrollButtonRightRect = q->style()->subElementRect(QStyle::SE_TabBarScrollRightButton, &opt, q);
        int scrollButtonWidth = q->style()->pixelMetric(QStyle::PM_TabBarScrollButtonWidth, &opt, q);

        // Normally SE_TabBarScrollLeftButton should have the same width as PM_TabBarScrollButtonWidth.
        // But if that is not the case, we set the actual button width to PM_TabBarScrollButtonWidth, and
        // use the extra space from SE_TabBarScrollLeftButton as margins towards the tabs.
        if (vertTabs) {
            scrollButtonLeftRect.setHeight(scrollButtonWidth);
            scrollButtonRightRect.setY(scrollButtonRightRect.bottom() + 1 - scrollButtonWidth);
            scrollButtonRightRect.setHeight(scrollButtonWidth);
            leftB->setArrowType(Qt::UpArrow);
            rightB->setArrowType(Qt::DownArrow);
        } else if (q->layoutDirection() == Qt::RightToLeft) {
            scrollButtonRightRect.setWidth(scrollButtonWidth);
            scrollButtonLeftRect.setX(scrollButtonLeftRect.right() + 1 - scrollButtonWidth);
            scrollButtonLeftRect.setWidth(scrollButtonWidth);
            leftB->setArrowType(Qt::RightArrow);
            rightB->setArrowType(Qt::LeftArrow);
        } else {
            scrollButtonLeftRect.setWidth(scrollButtonWidth);
            scrollButtonRightRect.setX(scrollButtonRightRect.right() + 1 - scrollButtonWidth);
            scrollButtonRightRect.setWidth(scrollButtonWidth);
            leftB->setArrowType(Qt::LeftArrow);
            rightB->setArrowType(Qt::RightArrow);
        }

        leftB->setGeometry(scrollButtonLeftRect);
        leftB->setEnabled(false);
        leftB->show();

        rightB->setGeometry(scrollButtonRightRect);
        rightB->setEnabled(last + scrollRect.left() > scrollRect.x() + scrollRect.width());
        rightB->show();
    } else {
        rightB->hide();
        leftB->hide();
    }

    layoutWidgets();
    q->tabLayoutChange();
}